

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O0

void * memleak_realloc(void *ptr,size_t size)

{
  void *pvVar1;
  avl_node *paVar2;
  size_t in_RSI;
  void *in_RDI;
  memleak_item query;
  memleak_item *item;
  avl_node *a;
  void *addr;
  avl_cmp_func *in_stack_ffffffffffffffa8;
  avl_node *in_stack_ffffffffffffffb0;
  avl_tree *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  avl_node *in_stack_ffffffffffffffc8;
  avl_tree *in_stack_ffffffffffffffd0;
  
  pvVar1 = realloc(in_RDI,in_RSI);
  if ((pvVar1 != (void *)0x0) && (start_sw != '\0')) {
    pthread_spin_lock(&lock);
    paVar2 = avl_search(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
    if (paVar2 != (avl_node *)0x0) {
      avl_remove(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      _memleak_add_to_index
                (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,
                 (char *)in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,
                 (uint8_t)((ulong)in_RDI >> 0x38));
      free(&paVar2[-2].right);
    }
    pthread_spin_unlock(&lock);
  }
  return pvVar1;
}

Assistant:

LIBMEMLEAK_API
void *memleak_realloc(void *ptr, size_t size)
{

    void *addr = (void *)realloc(ptr, size);
    if (addr && start_sw) {
        spin_lock(&lock);
        struct avl_node *a;
        struct memleak_item *item, query;

        query.addr = (uint64_t)ptr;
        a = avl_search(&tree_index, &query.avl, memleak_cmp);
        if (a) {
            item = _get_entry(a, struct memleak_item, avl);
            DBG("realloc from address 0x%016lx (allocated at %s:%ld, size %ld)\n\tto address 0x%016lx (size %ld)\n",
                item->addr, item->file, item->line, item->size, (uint64_t)addr, size);
            avl_remove(&tree_index, a);
            _memleak_add_to_index(addr, size, item->file, item->line, 0);
#ifdef _STACK_BACKTRACE
            free(item->btrace);
#endif
            free(item);
        }
        spin_unlock(&lock);
    }

    return addr;
}